

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerTraversalDecoder::DecodeAttributeSeams(MeshEdgebreakerTraversalDecoder *this)

{
  bool bVar1;
  long *plVar2;
  bool bVar3;
  long lVar4;
  pointer __p;
  pointer this_00;
  long lVar5;
  __uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_> local_38;
  
  lVar5 = (long)this->num_attribute_data_;
  if (lVar5 < 1) {
    bVar3 = true;
  }
  else {
    plVar2 = (long *)operator_new__(lVar5 * 0x18 + 8);
    *plVar2 = lVar5;
    lVar4 = 0;
    this_00 = (pointer)(plVar2 + 1);
    do {
      RAnsBitDecoder::RAnsBitDecoder(this_00);
      lVar4 = lVar4 + -0x18;
      this_00 = this_00 + 1;
    } while (lVar5 * -0x18 - lVar4 != 0);
    local_38._M_t.
    super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>.
    super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl =
         (tuple<draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>)
         (_Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>)
         0x0;
    std::__uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>::
    reset((__uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_> *)
          &this->attribute_connectivity_decoders_,(pointer)(plVar2 + 1));
    std::unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>::
    ~unique_ptr((unique_ptr<draco::RAnsBitDecoder[],_std::default_delete<draco::RAnsBitDecoder[]>_>
                 *)&local_38);
    lVar5 = -1;
    lVar4 = 0;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = this->num_attribute_data_ <= lVar5;
      if (this->num_attribute_data_ <= lVar5) {
        return bVar3;
      }
      bVar1 = RAnsBitDecoder::StartDecoding
                        ((RAnsBitDecoder *)
                         ((long)&(((this->attribute_connectivity_decoders_)._M_t.
                                   super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                                   .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>.
                                  _M_head_impl)->ans_decoder_).buf + lVar4),&this->buffer_);
      lVar4 = lVar4 + 0x18;
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool DecodeAttributeSeams() {
    // Prepare attribute decoding.
    if (num_attribute_data_ > 0) {
      attribute_connectivity_decoders_ = std::unique_ptr<BinaryDecoder[]>(
          new BinaryDecoder[num_attribute_data_]);
      for (int i = 0; i < num_attribute_data_; ++i) {
        if (!attribute_connectivity_decoders_[i].StartDecoding(&buffer_)) {
          return false;
        }
      }
    }
    return true;
  }